

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
Measurements::BenchmarkBase<Measurements::BestCase>::run_poly_vec
          (BenchmarkBase<Measurements::BestCase> *this)

{
  uint c;
  uint uVar1;
  
  for (uVar1 = 0; uVar1 < this->iteration_count; uVar1 = uVar1 + 1) {
    std::
    for_each<poly::vector_iterator<poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>,std::allocator_traits<std::allocator<Interface>>>>,Measurements::BenchmarkBase<Measurements::BestCase>::run_poly_vec()::_lambda(Interface&)_1_>
              (this[1].super_Benchmark._vptr_Benchmark,*(undefined8 *)&this[1].iteration_count);
  }
  return;
}

Assistant:

auto     run_poly_vec()
    {
        for (auto c = 0U; c < iteration_count; c++) {
            std::for_each(
                derived().pv.begin(), derived().pv.end(), [](Interface& i) { i.doYourThing(); });
        }
    }